

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitparser.cpp
# Opt level: O2

USTATUS __thiscall
FitParser::parseFitEntryAcm
          (FitParser *this,UByteArray *acm,UINT32 localOffset,UModelIndex *parent,CBString *info,
          UINT32 *realSize)

{
  int iVar1;
  UModelIndex index;
  UModelIndex index_00;
  UINT32 UVar2;
  byte *pbVar3;
  uint uVar4;
  char *s;
  undefined8 uVar5;
  undefined8 in_stack_fffffffffffffb98;
  TreeModel *in_stack_fffffffffffffba0;
  ulong local_458;
  CBString acmInfo;
  CBString local_3b0;
  CBString local_398;
  CBString local_380;
  intel_acm_t parsed;
  umemstream is;
  kstream ks;
  
  umemstream::umemstream(&is,(acm->d)._M_dataplus._M_p,(long)(int)(acm->d)._M_string_length);
  std::istream::seekg((long)&is,localOffset);
  kaitai::kstream::kstream(&ks,&is.super_istream);
  intel_acm_t::intel_acm_t(&parsed,&ks,(kstruct *)0x0,(intel_acm_t *)0x0);
  *realSize = *(UINT32 *)
               ((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x2c);
  if ((*(int *)((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x1c) !=
       0) && (*(int *)((long)parsed.m_header._M_t.
                             super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                             .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl +
                      0x1c) != 0x30000)) {
    uVar5 = 0x138a00;
    usprintf(&local_380,"%s: Intel ACM with unknown header version %08Xh found","parseFitEntryAcm");
    index.i = in_stack_fffffffffffffb98;
    index.r = (int)uVar5;
    index.c = (int)((ulong)uVar5 >> 0x20);
    index.m = in_stack_fffffffffffffba0;
    msg(this,(CBString)*parent,index);
    Bstrlib::CBString::~CBString(&local_380);
  }
  usprintf((CBString *)&stack0xfffffffffffffba0,
           "LocalOffset: %08Xh, EntryPoint: %08Xh, ACM SVN: %04Xh, Date: %02X.%02X.%04X",
           (ulong)localOffset,
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x48),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x30
                   ),
           (ulong)*(byte *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x28),
           (ulong)*(byte *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x29),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x2a
                   ));
  Bstrlib::CBString::operator=(info,(CBString *)&stack0xfffffffffffffba0);
  Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
  Bstrlib::CBString::CBString(&acmInfo);
  iVar1 = *(int *)((long)parsed.m_header._M_t.
                         super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                         .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x14)
  ;
  if (iVar1 == 3) {
    s = "BootGuard ACM ";
  }
  else if (iVar1 == 1) {
    s = "Startup ACM ";
  }
  else {
    if (iVar1 != 0) {
      usprintf((CBString *)&stack0xfffffffffffffba0,"Unknown ACM (%04Xh)");
      Bstrlib::CBString::operator=(&acmInfo,(CBString *)&stack0xfffffffffffffba0);
      Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
      uVar5 = 0x138b15;
      usprintf(&local_398,"%s: Intel ACM with unknown subtype %04Xh found","parseFitEntryAcm",
               (ulong)*(uint *)((long)parsed.m_header._M_t.
                                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                      _M_head_impl + 0x14));
      index_00.i = in_stack_fffffffffffffb98;
      index_00.r = (int)uVar5;
      index_00.c = (int)((ulong)uVar5 >> 0x20);
      index_00.m = in_stack_fffffffffffffba0;
      msg(this,(CBString)*parent,index_00);
      Bstrlib::CBString::~CBString(&local_398);
      goto LAB_00138b4f;
    }
    s = "TXT ACM ";
  }
  Bstrlib::CBString::operator=(&acmInfo,s);
LAB_00138b4f:
  UVar2 = TreeModel::base(this->model,parent);
  usprintf((CBString *)&stack0xfffffffffffffba0,
           "found at base %Xh\nModuleType: %04Xh\nModuleSubtype: %04Xh\nHeaderSize: %08Xh\nHeaderVersion: %08Xh\nChipsetId: %04Xh\nFlags: %04Xh\nModuleVendor: %04Xh\nDate: %02X.%02X.%04X\nModuleSize: %08Xh\nAcmSvn: %04Xh\nSeSvn: %04Xh\nCodeControlFlags: %08Xh\nErrorEntryPoint: %08Xh\nGdtMax: %08Xh\nGdtBase: %08Xh\nSegmentSel: %08Xh\nEntryPoint: %08Xh\nKeySize: %08Xh\nScratchSpaceSize: %08Xh\n"
           ,(ulong)(UVar2 + localOffset),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x10
                   ),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x14),
           (ulong)(uint)(*(int *)((long)parsed.m_header._M_t.
                                        super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                        .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                        _M_head_impl + 0x18) << 2),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x1c),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x20
                   ),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x22
                   ),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x24),
           (ulong)*(byte *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x28),
           (ulong)*(byte *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x29),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x2a
                   ),
           (ulong)(uint)(*(int *)((long)parsed.m_header._M_t.
                                        super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                        .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                        _M_head_impl + 0x2c) << 2),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x30
                   ),
           (ulong)*(ushort *)
                   ((long)parsed.m_header._M_t.
                          super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                          .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x32
                   ),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x34),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x38),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x3c),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x40),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x44),
           (ulong)*(uint *)((long)parsed.m_header._M_t.
                                  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                  .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                  _M_head_impl + 0x48),
           (ulong)(uint)(*(int *)((long)parsed.m_header._M_t.
                                        super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                        .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                        _M_head_impl + 0x70) << 2),
           (ulong)(uint)(*(int *)((long)parsed.m_header._M_t.
                                        super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                        .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                        _M_head_impl + 0x74) << 2));
  Bstrlib::CBString::operator+=(&acmInfo,(CBString *)&stack0xfffffffffffffba0);
  Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
  if (*(char *)((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x9c) ==
      '\0') {
    usprintf((CBString *)&stack0xfffffffffffffba0,"ACM RSA Public Key Exponent: %Xh\n",
             (ulong)*(uint *)((long)parsed.m_header._M_t.
                                    super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                                    .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>.
                                    _M_head_impl + 0x98));
    Bstrlib::CBString::operator+=(&acmInfo,(CBString *)&stack0xfffffffffffffba0);
  }
  else {
    usprintf((CBString *)&stack0xfffffffffffffba0,"ACM RSA Public Key Exponent: %Xh\n",0x10001);
    Bstrlib::CBString::operator+=(&acmInfo,(CBString *)&stack0xfffffffffffffba0);
  }
  Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
  usprintf((CBString *)&stack0xfffffffffffffba0,"ACM RSA Public Key:");
  Bstrlib::CBString::operator+=(&acmInfo,(CBString *)&stack0xfffffffffffffba0);
  Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
  uVar4 = 0;
  while( true ) {
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffba0,
               (string *)
               ((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x78));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffba0);
    if (local_458 <= uVar4) break;
    if ((uVar4 & 0x1f) == 0) {
      Bstrlib::CBString::operator+=(&acmInfo,"\n");
    }
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffba0,
               (string *)
               ((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0x78));
    pbVar3 = (byte *)std::__cxx11::string::at((ulong)&stack0xfffffffffffffba0);
    usprintf(&local_3b0,"%02X",(ulong)*pbVar3);
    Bstrlib::CBString::operator+=(&acmInfo,&local_3b0);
    Bstrlib::CBString::~CBString(&local_3b0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffba0);
    uVar4 = uVar4 + 1;
  }
  Bstrlib::CBString::operator+=(&acmInfo,"\n");
  Bstrlib::CBString::CBString((CBString *)&stack0xfffffffffffffba0,"ACM RSA Signature:");
  Bstrlib::CBString::operator+=(&acmInfo,(CBString *)&stack0xfffffffffffffba0);
  Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
  uVar4 = 0;
  while( true ) {
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffba0,
               (string *)
               ((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0xa0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffba0);
    if (local_458 <= uVar4) break;
    if ((uVar4 & 0x1f) == 0) {
      Bstrlib::CBString::operator+=(&acmInfo,"\n");
    }
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffba0,
               (string *)
               ((long)parsed.m_header._M_t.
                      super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
                      .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl + 0xa0));
    pbVar3 = (byte *)std::__cxx11::string::at((ulong)&stack0xfffffffffffffba0);
    usprintf(&local_3b0,"%02X",(ulong)*pbVar3);
    Bstrlib::CBString::operator+=(&acmInfo,&local_3b0);
    Bstrlib::CBString::~CBString(&local_3b0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffba0);
    uVar4 = uVar4 + 1;
  }
  Bstrlib::CBString::operator+=(&acmInfo,"\n");
  Bstrlib::CBString::operator+((CBString *)&stack0xfffffffffffffba0,&acmInfo,"\n");
  Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)&stack0xfffffffffffffba0);
  Bstrlib::CBString::~CBString((CBString *)&stack0xfffffffffffffba0);
  this->bgAcmFound = true;
  Bstrlib::CBString::~CBString(&acmInfo);
  intel_acm_t::~intel_acm_t(&parsed);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ks.m_io_str);
  umemstream::~umemstream(&is);
  return 0;
}

Assistant:

USTATUS FitParser::parseFitEntryAcm(const UByteArray & acm, const UINT32 localOffset, const UModelIndex & parent, UString & info, UINT32 &realSize)
{
    try {
        umemstream is(acm.constData(), acm.size());
        is.seekg(localOffset, is.beg);
        kaitai::kstream ks(&is);
        intel_acm_t parsed(&ks);
        intel_acm_t::header_t* header = parsed.header();
        
        realSize = header->module_size();
        
        // Check header version to be of a known value
        if (header->header_version() != intel_acm_t::KNOWN_HEADER_VERSION_V0_0
            && header->header_version() != intel_acm_t::KNOWN_HEADER_VERSION_V3_0) {
            msg(usprintf("%s: Intel ACM with unknown header version %08Xh found", __FUNCTION__, header->header_version()), parent);
        }
        
        // Valid ACM found
        info = usprintf("LocalOffset: %08Xh, EntryPoint: %08Xh, ACM SVN: %04Xh, Date: %02X.%02X.%04X",
                        localOffset,
                        header->entry_point(),
                        header->acm_svn(),
                        header->date_day(),
                        header->date_month(),
                        header->date_year());
        
        // Populate ACM info
        UString acmInfo;
        if (header->module_subtype() == intel_acm_t::MODULE_SUBTYPE_TXT) {
            acmInfo = "TXT ACM ";
        }
        else if(header->module_subtype() == intel_acm_t::MODULE_SUBTYPE_STARTUP) {
            acmInfo = "Startup ACM ";
        }
        else if (header->module_subtype() == intel_acm_t::MODULE_SUBTYPE_BOOT_GUARD) {
            acmInfo = "BootGuard ACM ";
        }
        else {
            acmInfo = usprintf("Unknown ACM (%04Xh)", header->module_subtype());
            msg(usprintf("%s: Intel ACM with unknown subtype %04Xh found", __FUNCTION__, header->module_subtype()), parent);
        }
        
        acmInfo += usprintf("found at base %Xh\n"
                            "ModuleType: %04Xh\n"
                            "ModuleSubtype: %04Xh\n"
                            "HeaderSize: %08Xh\n"
                            "HeaderVersion: %08Xh\n"
                            "ChipsetId: %04Xh\n"
                            "Flags: %04Xh\n"
                            "ModuleVendor: %04Xh\n"
                            "Date: %02X.%02X.%04X\n"
                            "ModuleSize: %08Xh\n"
                            "AcmSvn: %04Xh\n"
                            "SeSvn: %04Xh\n"
                            "CodeControlFlags: %08Xh\n"
                            "ErrorEntryPoint: %08Xh\n"
                            "GdtMax: %08Xh\n"
                            "GdtBase: %08Xh\n"
                            "SegmentSel: %08Xh\n"
                            "EntryPoint: %08Xh\n"
                            "KeySize: %08Xh\n"
                            "ScratchSpaceSize: %08Xh\n",
                            model->base(parent) + localOffset,
                            header->module_type(),
                            header->module_subtype(),
                            header->header_size() * (UINT32)sizeof(UINT32),
                            header->header_version(),
                            header->chipset_id(),
                            header->flags(),
                            header->module_vendor(),
                            header->date_day(), header->date_month(), header->date_year(),
                            header->module_size() * (UINT32)sizeof(UINT32),
                            header->acm_svn(),
                            header->se_svn(),
                            header->code_control_flags(),
                            header->error_entry_point(),
                            header->gdt_max(),
                            header->gdt_base(),
                            header->segment_sel(),
                            header->entry_point(),
                            header->key_size() * (UINT32)sizeof(UINT32),
                            header->scratch_space_size() * (UINT32)sizeof(UINT32));
        
        // Add RsaPublicKey
        if (header->_is_null_rsa_exponent() == false) {
            acmInfo += usprintf("ACM RSA Public Key Exponent: %Xh\n", header->rsa_exponent());
        }
        else {
            acmInfo += usprintf("ACM RSA Public Key Exponent: %Xh\n", INTEL_ACM_HARDCODED_RSA_EXPONENT);
        }
        acmInfo += usprintf("ACM RSA Public Key:");
        for (UINT32 i = 0; i < header->rsa_public_key().size(); i++) {
            if (i % 32 == 0) acmInfo += "\n";
            acmInfo += usprintf("%02X", (UINT8)header->rsa_public_key().at(i));
        }
        acmInfo += "\n";
        
        // Add RsaSignature
        acmInfo += UString("ACM RSA Signature:");
        for (UINT32 i = 0; i < header->rsa_signature().size(); i++) {
            if (i % 32 == 0) acmInfo +="\n";
            acmInfo += usprintf("%02X", (UINT8)header->rsa_signature().at(i));
        }
        acmInfo += "\n";
        
        securityInfo += acmInfo + "\n";
        bgAcmFound = true;
        return U_SUCCESS;
    }
    catch (...) {
        msg(usprintf("%s: unable to parse ACM", __FUNCTION__), parent);
        return U_INVALID_ACM;
    }
}